

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slice.h
# Opt level: O2

uint64_t __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
getFirstTag(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this)

{
  byte *pbVar1;
  
  pbVar1 = *(byte **)this;
  if ((*pbVar1 & 0xfe) != 0xee) {
    return 0;
  }
  if (*pbVar1 == 0xee) {
    return (ulong)pbVar1[1];
  }
  return *(uint64_t *)(pbVar1 + 1);
}

Assistant:

uint8_t const* getDataPtr() const noexcept { return _start; }